

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printAddrModeImm12Operand(MCInst *MI,uint OpNum,SStream *O,_Bool AlwaysPrintImm0)

{
  cs_struct *h;
  cs_detail *pcVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  MCOperand *op;
  MCOperand *op_00;
  ulong uVar5;
  char *fmt;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  _Var2 = MCOperand_isReg(op);
  if (!_Var2) {
    printOperand(MI,OpNum,O);
    return;
  }
  SStream_concat0(O,"[");
  set_mem_access(MI,true);
  h = MI->csh;
  uVar3 = MCOperand_getReg(op);
  printRegName(h,O,uVar3);
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar3 = MCOperand_getReg(op);
    pcVar1 = MI->flat_insn->detail;
    *(uint *)(pcVar1->groups + (ulong)(pcVar1->field_6).arm.op_count * 0x28 + 0x46) = uVar3;
  }
  uVar5 = MCOperand_getImm(op_00);
  uVar4 = (uint)uVar5;
  uVar3 = -uVar4;
  if ((int)uVar4 < 0) {
    uVar5 = (ulong)-uVar4;
    if ((int)uVar4 < -9) {
      fmt = ", #-0x%x";
    }
    else {
      fmt = ", #-%u";
    }
  }
  else {
    uVar3 = CONCAT31((int3)(uVar3 >> 8),uVar4 == 0);
    if (uVar4 == 0 && !AlwaysPrintImm0) goto LAB_0015f876;
    if (uVar4 < 10) {
      fmt = ", #%u";
    }
    else {
      fmt = ", #0x%x";
    }
    uVar5 = uVar5 & 0xffffffff;
  }
  SStream_concat(O,fmt,uVar5,(ulong)uVar3);
LAB_0015f876:
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar1 = MI->flat_insn->detail;
    *(uint *)(pcVar1->groups + (ulong)(pcVar1->field_6).arm.op_count * 0x28 + 0x52) = uVar4;
  }
  SStream_concat0(O,"]");
  set_mem_access(MI,false);
  return;
}

Assistant:

static void printAddrModeImm12Operand(MCInst *MI, unsigned OpNum,
		SStream *O, bool AlwaysPrintImm0)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	int32_t OffImm;
	bool isSub;

	if (!MCOperand_isReg(MO1)) {   // FIXME: This is for CP entries, but isn't right.
		printOperand(MI, OpNum, O);
		return;
	}

	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));

	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);

	OffImm = (int32_t)MCOperand_getImm(MO2);
	isSub = OffImm < 0;
	// Special value for #-0. All others are normal.
	if (OffImm == INT32_MIN)
		OffImm = 0;
	if (isSub) {
		if (OffImm < -HEX_THRESHOLD)
			SStream_concat(O, ", #-0x%x", -OffImm);
		else
			SStream_concat(O, ", #-%u", -OffImm);
	} else if (AlwaysPrintImm0 || OffImm > 0) {
		if (OffImm >= 0) {
			if (OffImm > HEX_THRESHOLD)
				SStream_concat(O, ", #0x%x", OffImm);
			else
				SStream_concat(O, ", #%u", OffImm);
		} else {
			if (OffImm < -HEX_THRESHOLD)
				SStream_concat(O, ", #-0x%x", -OffImm);
			else
				SStream_concat(O, ", #-%u", -OffImm);
		}
	}
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = OffImm;
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}